

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_compare.c
# Opt level: O0

int mpt_value_compare(mpt_value *val,void *cmp)

{
  int iVar1;
  mpt_type_traits *pmVar2;
  int local_30;
  int pos;
  mpt_type_traits *traits;
  void *cmp_local;
  mpt_value *val_local;
  
  pmVar2 = mpt_type_traits(val->_type);
  if (pmVar2 == (mpt_type_traits *)0x0) {
    val_local._4_4_ = -3;
  }
  else {
    iVar1 = (int)pmVar2->size;
    if (iVar1 == 0) {
      val_local._4_4_ = 0;
    }
    else {
      local_30 = memcmp(val->_addr,cmp,(long)iVar1);
      if (local_30 < 0) {
        local_30 = -local_30;
      }
      val_local._4_4_ = local_30;
    }
  }
  return val_local._4_4_;
}

Assistant:

extern int mpt_value_compare(const MPT_STRUCT(value) *val, const void *cmp)
{
	const MPT_STRUCT(type_traits) *traits;
	int pos;
	
	if (!(traits = mpt_type_traits(val->_type))) {
		return MPT_ERROR(BadType);
	}
	if (!(pos = traits->size)) {
		return 0;
	}
	pos = memcmp(val->_addr, cmp, pos);
	
	return pos < 0 ? -pos : pos;
}